

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O2

void __thiscall
crnlib::threaded_resampler::resample_y_task(threaded_resampler *this,uint64 data,void *param_2)

{
  Contrib_List *pCVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  pixel_format pVar7;
  void *pvVar8;
  ushort uVar9;
  uint uVar10;
  vec<4U,_float> *pvVar11;
  params *ppVar12;
  uint *puVar13;
  uint src_y_iter;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint i;
  float fVar19;
  vector<crnlib::vec<4U,_float>_> tmp;
  uint thread_index;
  vector<crnlib::vec<4U,_float>_> local_68;
  uint64 local_58;
  ulong local_50;
  Contrib_List *local_48;
  vec<4U,_float> local_40;
  
  local_58 = data;
  vector<crnlib::vec<4U,_float>_>::vector(&local_68,this->m_pParams->m_dst_width);
  ppVar12 = this->m_pParams;
  for (uVar18 = 0; uVar18 < ppVar12->m_dst_height; uVar18 = uVar18 + 1) {
    uVar6 = this->m_pTask_pool->m_num_threads;
    if ((uVar6 == 0) || ((int)((uVar18 & 0xffffffff) % (ulong)(uVar6 + 1)) == (int)local_58)) {
      pCVar1 = this->m_pY_contribs + uVar18;
      uVar9 = this->m_pY_contribs[uVar18].n;
      if (uVar9 == 1) {
        pvVar11 = (this->m_tmp_img).m_p + (uint)pCVar1->p->pixel * ppVar12->m_dst_width;
      }
      else {
        local_50 = uVar18;
        local_48 = pCVar1;
        for (uVar14 = 0; pvVar11 = local_68.m_p, uVar18 = local_50, uVar14 < uVar9;
            uVar14 = uVar14 + 1) {
          uVar10 = ppVar12->m_dst_width;
          uVar15 = local_48->p[uVar14].pixel * uVar10;
          pvVar11 = (this->m_tmp_img).m_p;
          fVar3 = local_48->p[uVar14].weight;
          lVar16 = 0;
          uVar18 = 0;
          if (uVar14 == 0) {
            for (; uVar18 < ppVar12->m_dst_width; uVar18 = uVar18 + 1) {
              operator*((vec<4U,_float> *)((long)pvVar11[uVar15].m_s + lVar16),fVar3);
              vec<4U,_float>::operator=
                        ((vec<4U,_float> *)((long)(local_68.m_p)->m_s + lVar16),&local_40);
              ppVar12 = this->m_pParams;
              lVar16 = lVar16 + 0x10;
            }
          }
          else {
            for (; uVar18 < uVar10; uVar18 = uVar18 + 1) {
              operator*((vec<4U,_float> *)((long)pvVar11[uVar15].m_s + lVar16),fVar3);
              vec<4U,_float>::operator+=
                        ((vec<4U,_float> *)((long)(local_68.m_p)->m_s + lVar16),&local_40);
              ppVar12 = this->m_pParams;
              uVar10 = ppVar12->m_dst_width;
              lVar16 = lVar16 + 0x10;
            }
          }
          uVar9 = local_48->n;
        }
      }
      pVar7 = ppVar12->m_fmt;
      uVar10 = ppVar12->m_dst_width;
      fVar3 = ppVar12->m_sample_low;
      fVar4 = ppVar12->m_sample_high;
      iVar17 = (int)uVar18;
      if (pVar7 == cPF_RGBA_F32) {
        uVar15 = ppVar12->m_dst_pitch * iVar17;
        pvVar8 = ppVar12->m_pDst_pixels;
        lVar16 = 0;
        do {
          pfVar2 = (float *)((long)pvVar11->m_s + lVar16);
          fVar5 = *pfVar2;
          fVar19 = fVar4;
          if (fVar5 <= fVar4) {
            fVar19 = fVar5;
          }
          *(uint *)((long)pvVar8 + lVar16 + (ulong)uVar15) =
               -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar19;
          fVar5 = pfVar2[1];
          fVar19 = fVar4;
          if (fVar5 <= fVar4) {
            fVar19 = fVar5;
          }
          *(uint *)((long)pvVar8 + lVar16 + (ulong)uVar15 + 4) =
               -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar19;
          fVar5 = pfVar2[2];
          fVar19 = fVar4;
          if (fVar5 <= fVar4) {
            fVar19 = fVar5;
          }
          *(uint *)((long)pvVar8 + lVar16 + (ulong)uVar15 + 8) =
               -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar19;
          fVar5 = pfVar2[3];
          fVar19 = fVar4;
          if (fVar5 <= fVar4) {
            fVar19 = fVar5;
          }
          *(uint *)((long)pvVar8 + lVar16 + (ulong)uVar15 + 0xc) =
               -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar19;
          lVar16 = lVar16 + 0x10;
        } while ((vec<4U,_float> *)(pfVar2 + 4) != pvVar11 + uVar10);
      }
      else if (pVar7 == cPF_RGBX_F32) {
        uVar15 = ppVar12->m_dst_pitch * iVar17;
        pvVar8 = ppVar12->m_pDst_pixels;
        lVar16 = 0;
        do {
          pfVar2 = (float *)((long)pvVar11->m_s + lVar16);
          fVar5 = *pfVar2;
          fVar19 = fVar4;
          if (fVar5 <= fVar4) {
            fVar19 = fVar5;
          }
          *(uint *)((long)pvVar8 + lVar16 + (ulong)uVar15) =
               -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar19;
          fVar5 = pfVar2[1];
          fVar19 = fVar4;
          if (fVar5 <= fVar4) {
            fVar19 = fVar5;
          }
          *(uint *)((long)pvVar8 + lVar16 + (ulong)uVar15 + 4) =
               -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar19;
          fVar5 = pfVar2[2];
          fVar19 = fVar4;
          if (fVar5 <= fVar4) {
            fVar19 = fVar5;
          }
          *(uint *)((long)pvVar8 + lVar16 + (ulong)uVar15 + 8) =
               -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar19;
          *(float *)((long)pvVar8 + lVar16 + (ulong)uVar15 + 0xc) = fVar4;
          lVar16 = lVar16 + 0x10;
        } while ((vec<4U,_float> *)(pfVar2 + 4) != pvVar11 + uVar10);
      }
      else if (pVar7 == cPF_Y_F32) {
        puVar13 = (uint *)((ulong)(ppVar12->m_dst_pitch * iVar17) + (long)ppVar12->m_pDst_pixels);
        lVar16 = 0;
        do {
          fVar5 = *(float *)((long)pvVar11->m_s + lVar16);
          fVar19 = fVar4;
          if (fVar5 <= fVar4) {
            fVar19 = fVar5;
          }
          *puVar13 = -(uint)(fVar5 < fVar3) & (uint)fVar3 | ~-(uint)(fVar5 < fVar3) & (uint)fVar19;
          puVar13 = puVar13 + 1;
          lVar16 = lVar16 + 0x10;
        } while ((ulong)uVar10 * 0x10 != lVar16);
      }
    }
  }
  vector<crnlib::vec<4U,_float>_>::~vector(&local_68);
  return;
}

Assistant:

void threaded_resampler::resample_y_task(uint64 data, void*)
    {
        const uint thread_index = (uint)data;

        crnlib::vector<vec4F> tmp(m_pParams->m_dst_width);

        for (uint dst_y = 0; dst_y < m_pParams->m_dst_height; dst_y++)
        {
            if (m_pTask_pool->get_num_threads())
            {
                if ((dst_y % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const Resampler::Contrib_List& contribs = m_pY_contribs[dst_y];

            const vec4F* pSrc;

            if (contribs.n == 1)
            {
                pSrc = m_tmp_img.get_ptr() + m_pParams->m_dst_width * contribs.p[0].pixel;
            }
            else
            {
                for (uint src_y_iter = 0; src_y_iter < contribs.n; src_y_iter++)
                {
                    const vec4F* p = m_tmp_img.get_ptr() + m_pParams->m_dst_width * contribs.p[src_y_iter].pixel;
                    const float weight = contribs.p[src_y_iter].weight;

                    if (!src_y_iter)
                    {
                        for (uint i = 0; i < m_pParams->m_dst_width; i++)
                        {
                            tmp[i] = p[i] * weight;
                        }
                    }
                    else
                    {
                        for (uint i = 0; i < m_pParams->m_dst_width; i++)
                        {
                            tmp[i] += p[i] * weight;
                        }
                    }
                }

                pSrc = tmp.get_ptr();
            }

            const vec4F* pSrc_end = pSrc + m_pParams->m_dst_width;

            const float l = m_pParams->m_sample_low;
            const float h = m_pParams->m_sample_high;

            switch (m_pParams->m_fmt)
            {
            case cPF_Y_F32:
            {
                float* pDst = reinterpret_cast<float*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    *pDst++ = math::clamp((*pSrc)[0], l, h);

                    pSrc++;
                } while (pSrc != pSrc_end);

                break;
            }
            case cPF_RGBX_F32:
            {
                vec4F* pDst = reinterpret_cast<vec4F*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    (*pDst)[0] = math::clamp((*pSrc)[0], l, h);
                    (*pDst)[1] = math::clamp((*pSrc)[1], l, h);
                    (*pDst)[2] = math::clamp((*pSrc)[2], l, h);
                    (*pDst)[3] = h;

                    pSrc++;
                    pDst++;
                } while (pSrc != pSrc_end);

                break;
            }
            case cPF_RGBA_F32:
            {
                vec4F* pDst = reinterpret_cast<vec4F*>(static_cast<uint8*>(m_pParams->m_pDst_pixels) + m_pParams->m_dst_pitch * dst_y);

                do
                {
                    (*pDst)[0] = math::clamp((*pSrc)[0], l, h);
                    (*pDst)[1] = math::clamp((*pSrc)[1], l, h);
                    (*pDst)[2] = math::clamp((*pSrc)[2], l, h);
                    (*pDst)[3] = math::clamp((*pSrc)[3], l, h);

                    pSrc++;
                    pDst++;
                } while (pSrc != pSrc_end);

                break;
            }
            default:
                break;
            }
        }
    }